

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O1

FILE * usrc_create(char *path,char *filename,int32_t copyrightYear,char *generator)

{
  FILE *pFVar1;
  char *header;
  char buffer [200];
  char acStack_e8 [200];
  
  header = acStack_e8;
  if (copyrightYear < 0x7e1) {
    header = anon_var_dwarf_15e6b;
  }
  else {
    sprintf(acStack_e8,anon_var_dwarf_15e8f);
  }
  pFVar1 = usrc_createWithHeader(path,filename,header,generator);
  return pFVar1;
}

Assistant:

U_CAPI FILE * U_EXPORT2
usrc_create(const char *path, const char *filename, int32_t copyrightYear, const char *generator) {
    const char *header;
    char buffer[200];
    if(copyrightYear<=2016) {
        header=
            "// © 2016 and later: Unicode, Inc. and others.\n"
            "// License & terms of use: http://www.unicode.org/copyright.html\n"
            "//\n"
            "// Copyright (C) 1999-2016, International Business Machines\n"
            "// Corporation and others.  All Rights Reserved.\n"
            "//\n"
            "// file name: %s\n"
            "//\n"
            "// machine-generated by: %s\n"
            "\n\n";
    } else {
        sprintf(buffer,
                "// © %d and later: Unicode, Inc. and others.\n"
                "// License & terms of use: http://www.unicode.org/copyright.html\n"
                "//\n"
                "// file name: %%s\n"
                "//\n"
                "// machine-generated by: %%s\n"
                "\n\n",
                (int)copyrightYear);
        header=buffer;
    }
    return usrc_createWithHeader(path, filename, header, generator);
}